

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_helpers.cc
# Opt level: O0

int google::protobuf::compiler::java::anon_unknown_9::GetExperimentalJavaFieldTypeForPacked
              (FieldDescriptor *field)

{
  LogMessage *pLVar1;
  string_view v;
  LogMessage local_30;
  Voidify local_1d;
  Type local_1c;
  FieldDescriptor *pFStack_18;
  int result;
  FieldDescriptor *field_local;
  
  pFStack_18 = field;
  local_1c = FieldDescriptor::type(field);
  if ((int)local_1c < 9) {
    field_local._4_4_ = local_1c + 0x22;
  }
  else {
    if ((int)local_1c < 0xd) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/internal_helpers.cc"
                 ,0x47);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
      v = FieldDescriptor::full_name(pFStack_18);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,v);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar1,(char (*) [18])0x20c70ed);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1d,pLVar1);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_30);
    }
    field_local._4_4_ = local_1c + (TYPE_SFIXED64|TYPE_ENUM);
  }
  return field_local._4_4_;
}

Assistant:

int GetExperimentalJavaFieldTypeForPacked(const FieldDescriptor* field) {
  int result = field->type();
  if (result < FieldDescriptor::TYPE_STRING) {
    return result + 34;
  } else if (result > FieldDescriptor::TYPE_BYTES) {
    return result + 30;
  } else {
    ABSL_LOG(FATAL) << field->full_name() << " can't be packed.";
    return 0;
  }
}